

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Del
          (PersistentStorageJson *this,RegistrarId *aId)

{
  Status SVar1;
  string local_38;
  RegistrarId *local_18;
  RegistrarId *aId_local;
  PersistentStorageJson *this_local;
  
  local_18 = aId;
  aId_local = (RegistrarId *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)JSON_NWK_abi_cxx11_);
  SVar1 = DelId<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
                    (this,aId,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Del(NetworkId const &aId)
{
    return DelId<Network, NetworkId>(aId, JSON_NWK);
}